

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::raytracing_pipeline_is_supported
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  VkDynamicState *pVVar1;
  undefined8 *puVar2;
  VkPipelineDynamicStateCreateInfo *pVVar3;
  VkPipelineShaderStageCreateInfo *pVVar4;
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar5;
  bool bVar6;
  VkPipelineCreateFlags2CreateInfo *pVVar7;
  size_type sVar8;
  long lVar9;
  uint uVar10;
  VkPipelineCreateFlags2 VVar11;
  ulong uVar12;
  allocator local_49;
  key_type local_48;
  
  pVVar7 = find_pnext<VkPipelineCreateFlags2CreateInfo>((VkStructureType)info->pNext,info);
  if (pVVar7 == (VkPipelineCreateFlags2CreateInfo *)0x0) {
    VVar11 = (VkPipelineCreateFlags2)info->flags;
  }
  else {
    VVar11 = pVVar7->flags;
  }
  if ((VVar11 & 0xffffffff96ec0738) == 0) {
    if (this->null_device != false) {
      return true;
    }
    if (((VVar11 & 0x3000) == 0) ||
       ((this->features).ray_tracing_pipeline.rayTraversalPrimitiveCulling != 0)) {
      uVar10 = (uint)VVar11;
      if ((uVar10 >> 0xb & 1) != 0) {
        std::__cxx11::string::string((string *)&local_48,"VK_KHR_pipeline_library",&local_49);
        sVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)this,&local_48);
        std::__cxx11::string::_M_dispose();
        if (sVar8 == 0) {
          return false;
        }
      }
      if (((((uVar10 >> 0x1d & 1) == 0) ||
           ((this->features).descriptor_buffer.descriptorBuffer != 0)) &&
          (((uVar10 >> 0x14 & 1) == 0 ||
           ((this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur != 0)))) &&
         (((uVar10 >> 0x18 & 1) == 0 || ((this->features).opacity_micromap.micromap != 0)))) {
        if ((VVar11 & 0x48000000) != 0 &&
            (this->features).pipeline_protected_access.pipelineProtectedAccess == 0) {
          return false;
        }
        if ((this->features).ray_tracing_pipeline.rayTracingPipeline == 0) {
          return false;
        }
        if (info->maxPipelineRayRecursionDepth <=
            (this->props).ray_tracing_pipeline.maxRayRecursionDepth) {
          pVVar3 = info->pDynamicState;
          if (pVVar3 != (VkPipelineDynamicStateCreateInfo *)0x0) {
            uVar12 = 0;
            while (pVVar3->dynamicStateCount != uVar12) {
              pVVar1 = pVVar3->pDynamicStates + uVar12;
              uVar12 = uVar12 + 1;
              if (*pVVar1 != VK_DYNAMIC_STATE_RAY_TRACING_PIPELINE_STACK_SIZE_KHR) {
                return false;
              }
            }
            bVar6 = pnext_chain_is_supported(this,pVVar3->pNext);
            if (!bVar6) {
              return false;
            }
          }
          if ((info->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) ||
             (info->pLibraryInterface != (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0)) {
            std::__cxx11::string::string((string *)&local_48,"VK_KHR_pipeline_library",&local_49);
            sVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,&local_48);
            std::__cxx11::string::_M_dispose();
            if (sVar8 == 0) {
              return false;
            }
          }
          uVar12 = 0xffffffffffffffff;
          lVar9 = 0;
          while (uVar12 = uVar12 + 1, uVar12 < info->stageCount) {
            pVVar4 = info->pStages;
            bVar6 = subgroup_size_control_is_supported
                              (this,(VkPipelineShaderStageCreateInfo *)
                                    ((long)&pVVar4->sType + lVar9));
            if (!bVar6) {
              return false;
            }
            puVar2 = (undefined8 *)((long)&pVVar4->pNext + lVar9);
            lVar9 = lVar9 + 0x30;
            bVar6 = pnext_chain_is_supported(this,(void *)*puVar2);
            if (!bVar6) {
              return false;
            }
          }
          pVVar5 = info->pLibraryInterface;
          if (((pVVar5 == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) ||
              ((pVVar5->maxPipelineRayHitAttributeSize <=
                (this->props).ray_tracing_pipeline.maxRayHitAttributeSize &&
               (bVar6 = pnext_chain_is_supported(this,pVVar5->pNext), bVar6)))) &&
             ((info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0 ||
              (bVar6 = pnext_chain_is_supported(this,info->pLibraryInfo->pNext), bVar6)))) {
            lVar9 = 8;
            uVar12 = 0xffffffffffffffff;
            do {
              uVar12 = uVar12 + 1;
              if (info->groupCount <= uVar12) {
                bVar6 = pnext_chain_is_supported(this,info->pNext);
                return bVar6;
              }
              puVar2 = (undefined8 *)((long)&info->pGroups->sType + lVar9);
              lVar9 = lVar9 + 0x30;
              bVar6 = pnext_chain_is_supported(this,(void *)*puVar2);
            } while (bVar6);
            return false;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::raytracing_pipeline_is_supported(const VkRayTracingPipelineCreateInfoKHR *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkPipelineCreateFlags2KHR supported_flags =
			VK_PIPELINE_CREATE_DISABLE_OPTIMIZATION_BIT |
			VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT |
			VK_PIPELINE_CREATE_DERIVATIVE_BIT |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_ANY_HIT_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_CLOSEST_HIT_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_INTERSECTION_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_MISS_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_SKIP_AABBS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_SKIP_TRIANGLES_BIT_KHR |
			VK_PIPELINE_CREATE_LIBRARY_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_PIPELINE_CREATE_RAY_TRACING_ALLOW_MOTION_BIT_NV |
			VK_PIPELINE_CREATE_RAY_TRACING_OPACITY_MICROMAP_BIT_EXT |
			VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
			VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT;

	auto flags = get_effective_flags(info);

	if ((flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((flags & (VK_PIPELINE_CREATE_RAY_TRACING_SKIP_AABBS_BIT_KHR |
	              VK_PIPELINE_CREATE_RAY_TRACING_SKIP_TRIANGLES_BIT_KHR)) != 0 &&
	    features.ray_tracing_pipeline.rayTraversalPrimitiveCulling == VK_FALSE)
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 &&
	    !enabled_extensions.count(VK_KHR_PIPELINE_LIBRARY_EXTENSION_NAME))
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT) != 0)
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

	if ((flags & VK_PIPELINE_CREATE_RAY_TRACING_ALLOW_MOTION_BIT_NV) != 0 &&
	    features.ray_tracing_motion_blur_nv.rayTracingMotionBlur == VK_FALSE)
		return false;

	if ((flags & VK_PIPELINE_CREATE_RAY_TRACING_OPACITY_MICROMAP_BIT_EXT) != 0 &&
	    features.opacity_micromap.micromap == VK_FALSE)
		return false;

	if ((flags & (VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
	              VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT)) != 0 &&
	    features.pipeline_protected_access.pipelineProtectedAccess == VK_FALSE)
		return false;

	if (features.ray_tracing_pipeline.rayTracingPipeline == VK_FALSE)
		return false;

	if (info->maxPipelineRayRecursionDepth > props.ray_tracing_pipeline.maxRayRecursionDepth)
		return false;

	if (info->pDynamicState)
	{
		for (uint32_t i = 0; i < info->pDynamicState->dynamicStateCount; i++)
			if (info->pDynamicState->pDynamicStates[i] != VK_DYNAMIC_STATE_RAY_TRACING_PIPELINE_STACK_SIZE_KHR)
				return false;
		if (!pnext_chain_is_supported(info->pDynamicState->pNext))
			return false;
	}

	if ((info->pLibraryInfo || info->pLibraryInterface) &&
	    !enabled_extensions.count(VK_KHR_PIPELINE_LIBRARY_EXTENSION_NAME))
		return false;

	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		if (!subgroup_size_control_is_supported(info->pStages[i]))
			return false;
		if (!pnext_chain_is_supported(info->pStages[i].pNext))
			return false;
	}

	if (info->pLibraryInterface)
	{
		if (info->pLibraryInterface->maxPipelineRayHitAttributeSize > props.ray_tracing_pipeline.maxRayHitAttributeSize)
			return false;
		if (!pnext_chain_is_supported(info->pLibraryInterface->pNext))
			return false;
	}

	if (info->pLibraryInfo)
	{
		if (!pnext_chain_is_supported(info->pLibraryInfo->pNext))
			return false;
	}

	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		if (!pnext_chain_is_supported(info->pGroups[i].pNext))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}